

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O1

void __thiscall
cmEventBasedConnection::cmEventBasedConnection
          (cmEventBasedConnection *this,cmConnectionBufferStrategy *bufferStrategy)

{
  (this->super_cmConnection).Server = (cmServerBase *)0x0;
  (this->super_cmConnection)._vptr_cmConnection = (_func_int **)&PTR_WriteData_00688c70;
  this->ReadStream = (uv_stream_t *)0x0;
  this->WriteStream = (uv_stream_t *)0x0;
  (this->RawReadBuffer)._M_dataplus._M_p = (pointer)&(this->RawReadBuffer).field_2;
  (this->RawReadBuffer)._M_string_length = 0;
  (this->RawReadBuffer).field_2._M_local_buf[0] = '\0';
  (this->BufferStrategy)._M_t.
  super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
  .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl = bufferStrategy;
  return;
}

Assistant:

cmEventBasedConnection::cmEventBasedConnection(
  cmConnectionBufferStrategy* bufferStrategy)
  : BufferStrategy(bufferStrategy)
{
}